

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O1

void __thiscall glauber::Output::Output(Output *this,VarMap *var_map)

{
  pointer *ppfVar1;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  pointer pfVar5;
  pointer pcVar6;
  pointer pfVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  char cVar10;
  any *paVar11;
  int *piVar12;
  bool *pbVar13;
  long lVar14;
  const_iterator cVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char **ppcVar16;
  runtime_error *prVar17;
  long *plVar18;
  size_type sVar19;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar20;
  pointer pfVar21;
  size_type *psVar22;
  anon_class_40_2_a59befe2 *__args;
  anon_class_40_2_a59befe2 *extraout_RDX;
  anon_class_40_2_a59befe2 *extraout_RDX_00;
  anon_class_40_2_a59befe2 *__args_00;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 local_88 [16];
  undefined1 auStack_78 [16];
  undefined4 local_68 [2];
  pointer local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"number-events","");
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar12 = boost::any_cast<int_const&>(paVar11);
  iVar4 = *piVar12;
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    operator_delete((void *)local_88._0_8_);
  }
  local_60 = (pointer)log10((double)iVar4);
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"quiet","");
  paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pbVar13 = boost::any_cast<bool_const&>(paVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_60;
  auVar8._8_8_ = in_XMM1_Qb;
  auVar8._0_8_ = in_XMM1_Qa;
  auVar3 = vroundsd_avx(auVar8,auVar3,10);
  bVar9 = *pbVar13;
  pfVar7 = (pointer)auVar3._0_8_;
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    local_60 = (pointer)auVar3._0_8_;
    operator_delete((void *)local_88._0_8_);
    pfVar7 = local_60;
  }
  local_60 = (pointer)CONCAT44(local_60._4_4_,(int)(double)pfVar7);
  if (bVar9 == false) {
    pfVar5 = (this->writers_).
             super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar5 == (this->writers_).
                  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar19 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar7 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_58 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar19 == 0) {
        pfVar20 = (function<void_(int,_double,_const_glauber::Event_&)> *)0x0;
      }
      else {
        pfVar20 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>
                            *)this,sVar19,(void *)0x0);
      }
      lVar14 = (long)pfVar5 - (long)pfVar7 >> 5;
      pfVar2 = pfVar20 + lVar14;
      *(undefined8 *)&(pfVar2->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar2->super__Function_base)._M_functor + 8) = 0;
      (pfVar2->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar2->_M_invoker = (_Invoker_type)0x0;
      *(undefined4 *)&pfVar20[lVar14].super__Function_base._M_functor = local_60._0_4_;
      pfVar20[lVar14]._M_invoker =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      pfVar20[lVar14].super__Function_base._M_manager =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      pfVar21 = std::
                vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_S_do_relocate(pfVar7,pfVar5,pfVar20,this);
      pfVar21 = std::
                vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_S_do_relocate(pfVar5,local_58,pfVar21 + 1,this);
      if (pfVar7 != (pointer)0x0) {
        operator_delete(pfVar7);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar20;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar21;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar20 + sVar19;
    }
    else {
      *(undefined8 *)&(pfVar5->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar5->super__Function_base)._M_functor + 8) = 0;
      (pfVar5->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar5->_M_invoker = (_Invoker_type)0x0;
      *(int *)&(pfVar5->super__Function_base)._M_functor = (int)(double)pfVar7;
      pfVar5->_M_invoker =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      (pfVar5->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
  }
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(var_map + 0x10),(key_type *)local_88);
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if (cVar15._M_node != (_Base_ptr)(var_map + 0x18)) {
    local_88._0_8_ = auStack_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
    paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    __rhs = &boost::any_cast<boost::filesystem::path_const&>(paVar11)->m_pathname;
    if ((undefined1 *)local_88._0_8_ != auStack_78) {
      operator_delete((void *)local_88._0_8_);
    }
    bVar9 = boost::filesystem::path::has_extension((path *)__rhs);
    if (bVar9) {
      local_88._0_8_ = ".hdf5";
      local_88._8_8_ = ".hdf";
      auStack_78._0_8_ = ".hd5";
      auStack_78._8_8_ = ".h5";
      boost::filesystem::path::extension();
      ppcVar16 = std::
                 __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<boost::filesystem::path_const>>
                           (local_88,local_68,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (ppcVar16 != (char **)local_68) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar17,"HDF5 output was not compiled");
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    boost::filesystem::detail::status((path *)local_88,(error_code *)__rhs);
    if ((uint)local_88._0_4_ < 2) {
      boost::filesystem::detail::create_directories((path *)__rhs,(error_code *)0x0);
    }
    else {
      cVar10 = boost::filesystem::detail::is_empty((path *)__rhs,(error_code *)0x0);
      if (cVar10 == '\0') {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"output directory \'",__rhs);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_88._0_8_ = *plVar18;
        psVar22 = (size_type *)(plVar18 + 2);
        if ((size_type *)local_88._0_8_ == psVar22) {
          auStack_78._0_8_ = *psVar22;
          auStack_78._8_8_ = plVar18[3];
          local_88._0_8_ = auStack_78;
        }
        else {
          auStack_78._0_8_ = *psVar22;
        }
        local_88._8_8_ = plVar18[1];
        *plVar18 = (long)psVar22;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::runtime_error::runtime_error(prVar17,(string *)local_88);
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_88._0_8_ = auStack_78;
    pcVar6 = (__rhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar6,pcVar6 + __rhs->_M_string_length);
    local_68[0] = local_60._0_4_;
    pfVar7 = (this->writers_).
             super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar7 == (this->writers_).
                  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar19 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar5 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_60 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar19 == 0) {
        pfVar20 = (function<void_(int,_double,_const_glauber::Event_&)> *)0x0;
        __args_00 = extraout_RDX;
      }
      else {
        pfVar20 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>
                            *)this,sVar19,(void *)0x0);
        __args_00 = extraout_RDX_00;
      }
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)(pfVar20 + ((long)pfVar7 - (long)pfVar5 >> 5)),
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args_00);
      pfVar21 = std::
                vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_S_do_relocate(pfVar5,pfVar7,pfVar20,this);
      pfVar21 = std::
                vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_S_do_relocate(pfVar7,local_60,pfVar21 + 1,this);
      if (pfVar5 != (pointer)0x0) {
        operator_delete(pfVar5);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar20;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar21;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar20 + sVar19;
    }
    else {
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)pfVar7,
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args);
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    if ((undefined1 *)local_88._0_8_ != auStack_78) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, const Event& event) {
        write_stream(std::cout, width, num, impact_param, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (is_hdf5(output_path)) {
#ifdef GLAUBER_HDF5
      if (fs::exists(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // GLAUBER_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      writers_.emplace_back(
        [output_path, width](int num, double impact_param, const Event& event) {
          write_text_file(output_path, width, num, impact_param, event);
        }
      );
    }
  }
}